

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::matchToken(Parser *this,TokenType type,bool optional)

{
  Token *pTVar1;
  Token *token;
  bool optional_local;
  TokenType type_local;
  Parser *this_local;
  
  if (optional) {
    pTVar1 = peekToken(this,0);
    if (pTVar1->type == type) {
      eatToken(this);
    }
    this_local._7_1_ = true;
  }
  else {
    pTVar1 = nextToken(this);
    this_local._7_1_ = pTVar1->type == type;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::matchToken(TokenType type, bool optional)
{
	if (optional)
	{
		const Token& token = peekToken();
		if (token.type == type)
			eatToken();
		return true;
	}
	
	return nextToken().type == type;
}